

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O2

int mg_connect_ca(mg_session_params *params,mg_session **session,mg_allocator *allocator)

{
  addrinfo *paVar1;
  sockaddr *psVar2;
  int iVar3;
  int iVar4;
  mg_session *session_00;
  char *pcVar5;
  int *piVar6;
  uint sockfd;
  addrinfo **__pai;
  uint local_48c;
  mg_session **local_488;
  char portstr [6];
  sockaddr peer_addr;
  addrinfo *addr_list;
  char hostname [1025];
  
  session_00 = mg_session_init(allocator);
  if (session_00 == (mg_session *)0x0) {
    return -3;
  }
  iVar3 = validate_session_params(params,session_00);
  if (iVar3 != 0) goto LAB_00104d7a;
  addr_list = (addrinfo *)0x0;
  hostname[0] = '\0';
  hostname[1] = '\0';
  hostname[2] = '\0';
  hostname[3] = '\0';
  hostname[4] = '\0';
  hostname[5] = '\0';
  hostname[6] = '\0';
  hostname[7] = '\0';
  hostname[0x20] = '\0';
  hostname[0x21] = '\0';
  hostname[0x22] = '\0';
  hostname[0x23] = '\0';
  hostname[0x24] = '\0';
  hostname[0x25] = '\0';
  hostname[0x26] = '\0';
  hostname[0x27] = '\0';
  hostname[0x28] = '\0';
  hostname[0x29] = '\0';
  hostname[0x2a] = '\0';
  hostname[0x2b] = '\0';
  hostname[0x2c] = '\0';
  hostname[0x2d] = '\0';
  hostname[0x2e] = '\0';
  hostname[0x2f] = '\0';
  hostname[0x10] = '\0';
  hostname[0x11] = '\0';
  hostname[0x12] = '\0';
  hostname[0x13] = '\0';
  hostname[0x14] = '\0';
  hostname[0x15] = '\0';
  hostname[0x16] = '\0';
  hostname[0x17] = '\0';
  hostname[0x18] = '\0';
  hostname[0x19] = '\0';
  hostname[0x1a] = '\0';
  hostname[0x1b] = '\0';
  hostname[0x1c] = '\0';
  hostname[0x1d] = '\0';
  hostname[0x1e] = '\0';
  hostname[0x1f] = '\0';
  hostname[8] = '\x01';
  hostname[9] = '\0';
  hostname[10] = '\0';
  hostname[0xb] = '\0';
  hostname[0xc] = '\x06';
  hostname[0xd] = '\0';
  hostname[0xe] = '\0';
  hostname[0xf] = '\0';
  sprintf(portstr,"%u",(ulong)params->port);
  pcVar5 = params->host;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = params->address;
    if (pcVar5 == (char *)0x0) goto LAB_00104ec6;
    hostname[0] = '\x04';
    hostname[1] = '\0';
    hostname[2] = '\0';
    hostname[3] = '\0';
  }
  __pai = (addrinfo **)&addr_list;
  iVar3 = getaddrinfo(pcVar5,portstr,(addrinfo *)hostname,__pai);
  if (iVar3 != 0) {
    pcVar5 = gai_strerror(iVar3);
    mg_session_set_error(session_00,"getaddrinfo failed: %s",pcVar5);
    iVar3 = -8;
    goto LAB_00104d7a;
  }
  local_48c = 0xffffff9c;
  iVar3 = 0;
  local_488 = session;
  while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
    local_48c = mg_socket_create(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
    iVar3 = mg_socket_create_handle_error(local_48c,session_00);
    if (iVar3 == 0) {
      iVar3 = mg_socket_connect(local_48c,(sockaddr *)paVar1->ai_addr,paVar1->ai_addrlen);
      iVar3 = mg_socket_connect_handle_error((int *)&local_48c,iVar3,session_00);
      if (iVar3 == 0) {
        psVar2 = paVar1->ai_addr;
        peer_addr.sa_family = psVar2->sa_family;
        peer_addr.sa_data[0] = psVar2->sa_data[0];
        peer_addr.sa_data[1] = psVar2->sa_data[1];
        peer_addr.sa_data[2] = psVar2->sa_data[2];
        peer_addr.sa_data[3] = psVar2->sa_data[3];
        peer_addr.sa_data[4] = psVar2->sa_data[4];
        peer_addr.sa_data[5] = psVar2->sa_data[5];
        peer_addr.sa_data._6_8_ = *(undefined8 *)(psVar2->sa_data + 6);
        iVar3 = 0;
        break;
      }
    }
    __pai = &paVar1->ai_next;
  }
  freeaddrinfo((addrinfo *)addr_list);
  if (local_48c == 0xffffff9c) {
    session = local_488;
    if (iVar3 != 0) goto LAB_00104d7a;
    sockfd = 0xffffffff;
  }
  else {
    iVar3 = mg_socket_options(local_48c,session_00);
    session = local_488;
    sockfd = local_48c;
    if (iVar3 != 0) goto LAB_00104d7a;
  }
  session = local_488;
  if (params->sslmode == MG_SSLMODE_REQUIRE) {
    iVar3 = mg_secure_transport_init
                      (sockfd,params->sslcert,params->sslkey,(mg_secure_transport **)portstr,
                       allocator);
    if (iVar3 != 0) {
      pcVar5 = "failed to initialize secure connection";
      goto LAB_00104ea5;
    }
    session_00->transport = (mg_transport *)CONCAT44(stack0xfffffffffffffb84,portstr._0_4_);
    if (params->trust_callback == (_func_int_char_ptr_char_ptr_char_ptr_char_ptr_void_ptr *)0x0) {
LAB_00104f84:
      hostname._0_8_ = hostname._0_8_ & 0xffffffff00000000;
      addr_list = (addrinfo *)CONCAT44(addr_list._4_4_,0x1000000);
      portstr[0] = '\0';
      portstr[1] = '\0';
      portstr[2] = '\x01';
      portstr[3] = '\x04';
      mg_transport_suspend_until_ready_to_write(session_00->transport);
      iVar3 = mg_transport_send(session_00->transport,MG_HANDSHAKE_MAGIC,4);
      if ((((iVar3 == 0) && (iVar3 = mg_transport_send(session_00->transport,portstr,4), iVar3 == 0)
           ) && (iVar3 = mg_transport_send(session_00->transport,(char *)&addr_list,4), iVar3 == 0))
         && ((iVar3 = mg_transport_send(session_00->transport,hostname,4), iVar3 == 0 &&
             (iVar3 = mg_transport_send(session_00->transport,hostname,4), iVar3 == 0)))) {
        mg_transport_suspend_until_ready_to_read(session_00->transport);
        iVar3 = mg_transport_recv(session_00->transport,(char *)&local_48c,4);
        if (iVar3 == 0) {
          if (local_48c == (uint)addr_list) {
            session_00->version = 1;
            iVar3 = mg_bolt_init_v1(session_00,params);
          }
          else {
            if (local_48c != portstr._0_4_) {
              mg_session_set_error
                        (session_00,"unsupported protocol version: %u",
                         (ulong)(local_48c >> 0x18 | (local_48c & 0xff0000) >> 8 |
                                 (local_48c & 0xff00) << 8 | local_48c << 0x18));
              iVar3 = -10;
              session = local_488;
              goto LAB_00104d7a;
            }
            session_00->version = 4;
            iVar3 = mg_bolt_init_v4(session_00,params);
          }
          session = local_488;
          if (((iVar3 == 0) &&
              (iVar3 = mg_session_receive_message(session_00), session = local_488, iVar3 == 0)) &&
             (iVar3 = mg_session_read_bolt_message(session_00,(mg_message **)hostname),
             session = local_488, iVar3 == 0)) {
            if (*(int *)hostname._0_8_ == 1) {
              iVar3 = 0;
            }
            else if (*(int *)hostname._0_8_ == 2) {
              iVar3 = handle_failure_message
                                (session_00,*(mg_message_failure **)(hostname._0_8_ + 8));
            }
            else {
              mg_session_set_error(session_00,"unexpected message type");
              iVar3 = -10;
            }
            mg_message_destroy_ca((mg_message *)hostname._0_8_,session_00->decoder_allocator);
            session = local_488;
            if (iVar3 == 0) {
              session_00->status = 0;
              *local_488 = session_00;
              return 0;
            }
          }
        }
        else {
          mg_session_set_error(session_00,"failed to receive handshake response");
          iVar3 = -2;
          session = local_488;
        }
      }
      else {
        iVar3 = -1;
        mg_session_set_error(session_00,"failed to send handshake data");
      }
      goto LAB_00104d7a;
    }
    if (peer_addr.sa_family == 10) {
      pcVar5 = peer_addr.sa_data + 6;
      iVar3 = 10;
    }
    else {
      if (peer_addr.sa_family != 2) goto LAB_00104ec6;
      pcVar5 = peer_addr.sa_data + 2;
      iVar3 = 2;
    }
    pcVar5 = inet_ntop(iVar3,pcVar5,(char *)&addr_list,0x2e);
    if (pcVar5 == (char *)0x0) {
      piVar6 = __errno_location();
      pcVar5 = strerror(*piVar6);
      mg_session_set_error(session_00,"failed to get server IP: %s",pcVar5);
      iVar3 = -8;
    }
    else {
      iVar3 = getnameinfo((sockaddr *)&peer_addr,0x10,hostname,0x401,(char *)0x0,0,0);
      if (iVar3 != 0) {
        builtin_strncpy(hostname,"unknown",8);
      }
      iVar3 = (*params->trust_callback)
                        (hostname,(char *)&addr_list,
                         *(char **)(CONCAT44(stack0xfffffffffffffb84,portstr._0_4_) + 0x38),
                         *(char **)(CONCAT44(stack0xfffffffffffffb84,portstr._0_4_) + 0x40),
                         params->trust_data);
      if (iVar3 == 0) goto LAB_00104f84;
      mg_session_set_error(session_00,"trust callback returned non-zero value");
      iVar3 = -0x12;
    }
  }
  else {
    if (params->sslmode != MG_SSLMODE_DISABLE) goto LAB_00104ec6;
    iVar3 = mg_raw_transport_init(sockfd,(mg_raw_transport **)&session_00->transport,allocator);
    if (iVar3 == 0) goto LAB_00104f84;
    pcVar5 = "failed to initialize connection";
LAB_00104ea5:
    mg_session_set_error(session_00,pcVar5);
  }
  if ((-1 < (int)sockfd) && (iVar4 = mg_socket_close(sockfd), iVar4 != 0)) {
LAB_00104ec6:
    abort();
  }
LAB_00104d7a:
  *session = session_00;
  mg_session_invalidate(session_00);
  return iVar3;
}

Assistant:

int mg_connect_ca(const mg_session_params *params, mg_session **session,
                  mg_allocator *allocator) {
  // Useful read https://akkadia.org/drepper/userapi-ipv6.html.
  mg_session *tsession = mg_session_init(allocator);
  if (!tsession) {
    return MG_ERROR_OOM;
  }

  int status = 0;
  int sockfd = -1;

  status = validate_session_params(params, tsession);
  if (status != 0) {
    goto cleanup;
  }

  struct sockaddr peer_addr;
  status = init_tcp_connection(params, &sockfd, &peer_addr, tsession);
  if (status != 0) {
    goto cleanup;
  }
  switch (params->sslmode) {
    case MG_SSLMODE_DISABLE:
      status = mg_raw_transport_init(
          sockfd, (mg_raw_transport **)&tsession->transport, allocator);
      if (status != 0) {
        mg_session_set_error(tsession, "failed to initialize connection");
        goto cleanup;
      }
      break;
#ifndef __EMSCRIPTEN__
    case MG_SSLMODE_REQUIRE: {
      mg_secure_transport *ttransport;
      status = mg_secure_transport_init(sockfd, params->sslcert, params->sslkey,
                                        &ttransport, allocator);
      if (status != 0) {
        mg_session_set_error(tsession,
                             "failed to initialize secure connection");
        goto cleanup;
      }
      tsession->transport = (mg_transport *)ttransport;
      if (params->trust_callback) {
        char ip[INET6_ADDRSTRLEN];
        char hostname[NI_MAXHOST];
        status = get_hostname_and_ip(&peer_addr, hostname, ip, tsession);
        if (status != 0) {
          goto cleanup;
        }
        int trust_result = params->trust_callback(
            hostname, ip, ttransport->peer_pubkey_type,
            ttransport->peer_pubkey_fp, params->trust_data);
        if (trust_result != 0) {
          mg_session_set_error(tsession,
                               "trust callback returned non-zero value");
          status = MG_ERROR_TRUST_CALLBACK;
          goto cleanup;
        }
      }
      break;
    }
#endif
    default:
      // Should not get here.
      abort();
  }

  // mg_transport object took ownership of the socket.
  sockfd = -1;
  status = mg_bolt_handshake(tsession);
  if (status != 0) {
    goto cleanup;
  }
  status = mg_bolt_init(tsession, params);
  if (status != 0) {
    goto cleanup;
  }

  tsession->status = MG_SESSION_READY;
  *session = tsession;
  return 0;

cleanup:
  if (sockfd >= 0 && mg_socket_close(sockfd) != 0) {
    abort();
  }
  *session = tsession;
  mg_session_invalidate(tsession);
  return status;
}